

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O1

void __thiscall Lodtalk::StackMemory::StackMemory(StackMemory *this,VMContext *context)

{
  pointer *pppSVar1;
  iterator iVar2;
  uint8_t *puVar3;
  StackPage *pSVar4;
  long lVar5;
  StackPage *page;
  StackPage *local_40;
  StackFrame *local_38;
  
  this->context = context;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stackFrame).framePointer = (uint8_t *)0x0;
  (this->stackFrame).stackPointer = (uint8_t *)0x0;
  this->stackSize = 0x20000;
  puVar3 = (uint8_t *)operator_new__(0x20000);
  local_38 = &this->stackFrame;
  this->stackMemoryLowest = puVar3;
  this->stackMemoryHighest = puVar3 + 0x20000;
  lVar5 = 0;
  do {
    pSVar4 = (StackPage *)operator_new(0x58);
    StackPage::StackPage(pSVar4,context,this->stackMemoryLowest + lVar5);
    iVar2._M_current =
         (this->stackPages).
         super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_40 = pSVar4;
    if (iVar2._M_current ==
        (this->stackPages).
        super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>>::
      _M_realloc_insert<Lodtalk::StackPage*const&>
                ((vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>> *)
                 &this->stackPages,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = pSVar4;
      pppSVar1 = &(this->stackPages).
                  super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar2._M_current =
         (this->freePages).
         super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->freePages).
        super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>>::
      _M_realloc_insert<Lodtalk::StackPage*const&>
                ((vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>> *)&this->freePages
                 ,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      pppSVar1 = &(this->freePages).
                  super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    lVar5 = lVar5 + 0x2000;
  } while (lVar5 != 0x20000);
  pSVar4 = allocatePage(this);
  this->currentPage = pSVar4;
  puVar3 = pSVar4->stackPageHighest;
  pSVar4->baseFramePointer = puVar3;
  (pSVar4->headFrame).framePointer = (uint8_t *)0x0;
  (pSVar4->headFrame).stackPointer = puVar3;
  puVar3 = (this->currentPage->headFrame).stackPointer;
  local_38->framePointer = (this->currentPage->headFrame).framePointer;
  local_38->stackPointer = puVar3;
  return;
}

Assistant:

StackMemory::StackMemory(VMContext *context)
    : context(context)
{
    stackSize = StackMemoryPageSize*StackPageCount;
    stackMemoryLowest = new uint8_t[stackSize];
    stackMemoryHighest = stackMemoryLowest + stackSize;

    for (size_t i = 0; i < StackPageCount; ++i)
    {
        auto page = new StackPage(context, stackMemoryLowest + i*StackMemoryPageSize);
        stackPages.push_back(page);
        freePages.push_back(page);
    }

    currentPage = allocatePage();
    currentPage->startUsing();
    stackFrame = currentPage->headFrame;
}